

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTest * __thiscall cmMakefile::CreateTest(cmMakefile *this,string *testName)

{
  const_iterator cVar1;
  cmTest *this_00;
  mapped_type *ppcVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
          ::find(&(this->Tests)._M_t,testName);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->Tests)._M_t._M_impl.super__Rb_tree_header) ||
     (this_00 = *(cmTest **)(cVar1._M_node + 2), this_00 == (cmTest *)0x0)) {
    this_00 = (cmTest *)operator_new(0x90);
    cmTest::cmTest(this_00,this);
    cmTest::SetName(this_00,testName);
    ppcVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
              ::operator[](&this->Tests,testName);
    *ppcVar2 = this_00;
  }
  return this_00;
}

Assistant:

cmTest* cmMakefile::CreateTest(const std::string& testName)
{
  cmTest* test = this->GetTest(testName);
  if (test) {
    return test;
  }
  test = new cmTest(this);
  test->SetName(testName);
  this->Tests[testName] = test;
  return test;
}